

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O2

CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> * __thiscall
Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator_
          (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *this,
          Scalar *s)

{
  Index *pIVar1;
  Scalar SVar2;
  long lVar3;
  uint __line;
  long lVar4;
  char *__assertion;
  
  lVar4 = this->m_col;
  if (lVar4 == 3) {
    lVar3 = this->m_currentBlockRows;
    this->m_col = 0;
    pIVar1 = &this->m_row;
    lVar4 = *pIVar1;
    *pIVar1 = *pIVar1 + lVar3;
    this->m_currentBlockRows = 1;
    if (*pIVar1 == 0 || SCARRY8(lVar4,lVar3) != *pIVar1 < 0) {
      lVar4 = 0;
LAB_0012eba7:
      SVar2 = *s;
      this->m_col = lVar4 + 1;
      (this->m_xpr->super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>
      ).super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data
      [lVar4 * 3U + this->m_row] = SVar2;
      return this;
    }
    __assertion = "m_row<m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
    ;
    __line = 0x49;
  }
  else if (lVar4 < 3) {
    if (this->m_currentBlockRows == 1) goto LAB_0012eba7;
    __assertion = "m_currentBlockRows==1";
    __line = 0x4d;
  }
  else {
    __assertion = 
    "m_col<m_xpr.cols() && \"Too many coefficients passed to comma initializer (operator<<)\"";
    __line = 0x4c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CommaInitializer.h"
                ,__line,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>>::operator,(const Scalar &) [MatrixType = Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const Scalar& s)
  {
    if (m_col==m_xpr.cols())
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = 1;
      eigen_assert(m_row<m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert(m_col<m_xpr.cols()
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==1);
    m_xpr.coeffRef(m_row, m_col++) = s;
    return *this;
  }